

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::TreeNodeBehaviorIsOpen(ImGuiID id,ImGuiTreeNodeFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiStorage *this;
  ImGuiContext *pIVar2;
  int iVar3;
  bool local_31;
  int stored_value;
  bool is_open;
  ImGuiStorage *storage;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTreeNodeFlags flags_local;
  ImGuiID id_local;
  
  pIVar2 = GImGui;
  if ((flags & 0x100U) == 0) {
    pIVar1 = GImGui->CurrentWindow;
    this = (pIVar1->DC).StateStorage;
    if (GImGui->NextTreeNodeOpenCond == 0) {
      iVar3 = ImGuiStorage::GetInt(this,id,(uint)((flags & 0x20U) != 0));
      local_31 = iVar3 != 0;
    }
    else {
      if ((GImGui->NextTreeNodeOpenCond & 1U) == 0) {
        iVar3 = ImGuiStorage::GetInt(this,id,-1);
        if (iVar3 == -1) {
          local_31 = (bool)(pIVar2->NextTreeNodeOpenVal & 1);
          ImGuiStorage::SetInt(this,id,(uint)local_31);
        }
        else {
          local_31 = iVar3 != 0;
        }
      }
      else {
        local_31 = (bool)(GImGui->NextTreeNodeOpenVal & 1);
        ImGuiStorage::SetInt(this,id,(uint)local_31);
      }
      pIVar2->NextTreeNodeOpenCond = 0;
    }
    if ((((pIVar2->LogEnabled & 1U) != 0) && ((flags & 0x10U) == 0)) &&
       ((pIVar1->DC).TreeDepth < pIVar2->LogAutoExpandMaxDepth)) {
      local_31 = true;
    }
    flags_local._3_1_ = local_31;
  }
  else {
    flags_local._3_1_ = false;
  }
  return flags_local._3_1_;
}

Assistant:

bool ImGui::TreeNodeBehaviorIsOpen(ImGuiID id, ImGuiTreeNodeFlags flags)
{
    if (flags & ImGuiTreeNodeFlags_Leaf)
        return false;

    // We only write to the tree storage if the user clicks (or explicitly use SetNextTreeNode*** functions)
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStorage* storage = window->DC.StateStorage;

    bool is_open;
    if (g.NextTreeNodeOpenCond != 0)
    {
        if (g.NextTreeNodeOpenCond & ImGuiCond_Always)
        {
            is_open = g.NextTreeNodeOpenVal;
            storage->SetInt(id, is_open);
        }
        else
        {
            // We treat ImGuiCond_Once and ImGuiCond_FirstUseEver the same because tree node state are not saved persistently.
            const int stored_value = storage->GetInt(id, -1);
            if (stored_value == -1)
            {
                is_open = g.NextTreeNodeOpenVal;
                storage->SetInt(id, is_open);
            }
            else
            {
                is_open = stored_value != 0;
            }
        }
        g.NextTreeNodeOpenCond = 0;
    }
    else
    {
        is_open = storage->GetInt(id, (flags & ImGuiTreeNodeFlags_DefaultOpen) ? 1 : 0) != 0;
    }

    // When logging is enabled, we automatically expand tree nodes (but *NOT* collapsing headers.. seems like sensible behavior).
    // NB- If we are above max depth we still allow manually opened nodes to be logged.
    if (g.LogEnabled && !(flags & ImGuiTreeNodeFlags_NoAutoOpenOnLog) && window->DC.TreeDepth < g.LogAutoExpandMaxDepth)
        is_open = true;

    return is_open;
}